

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::TopNBoundaryValue::TopNBoundaryValue(TopNBoundaryValue *this,PhysicalTopN *op)

{
  OrderType OVar1;
  OrderByNullType OVar2;
  const_reference pvVar3;
  pointer pEVar4;
  vector<duckdb::BoundOrderByNode,_true> *this_00;
  LogicalType local_40;
  
  this->op = op;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->boundary_value)._M_dataplus._M_p = (pointer)&(this->boundary_value).field_2;
  (this->boundary_value)._M_string_length = 0;
  (this->boundary_value).field_2._M_local_buf[0] = '\0';
  this->is_set = false;
  this_00 = &op->orders;
  pvVar3 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&pvVar3->expression);
  LogicalType::LogicalType(&local_40,&pEVar4->return_type);
  Vector::Vector(&this->boundary_vector,&local_40,0x800);
  LogicalType::~LogicalType(&local_40);
  pvVar3 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
  OVar1 = pvVar3->type;
  pvVar3 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
  OVar2 = pvVar3->null_order;
  (this->boundary_modifiers).order_type = OVar1;
  (this->boundary_modifiers).null_type = OVar2;
  return;
}

Assistant:

explicit TopNBoundaryValue(const PhysicalTopN &op)
	    : op(op), boundary_vector(op.orders[0].expression->return_type),
	      boundary_modifiers(op.orders[0].type, op.orders[0].null_order) {
	}